

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O1

void mxx::custom_op<unsigned_short>::mpi_user_function(void *in,void *inout,int *n,MPI_Datatype *dt)

{
  function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *__x;
  func_t f;
  int local_4c;
  _Any_data local_48;
  _Manager_type local_38;
  
  local_4c = 0x543;
  __x = attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::get
                  (dt,&local_4c);
  std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>::function
            ((function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *)&local_48,__x);
  std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>::operator()
            ((function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *)&local_48,in,inout,n,dt);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

static void mpi_user_function(void* in, void* inout, int* n, MPI_Datatype* dt) {
        // get the std::function from the MPI_Datatype and call it
        func_t f = attr_map<int, func_t>::get(*dt, 1347);
        f(in, inout, n, dt);
    }